

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayObject.cpp
# Opt level: O2

void __thiscall Js::ArrayObject::ThrowItemNotConfigurableError(ArrayObject *this,PropertyId propId)

{
  ScriptContext *scriptContext;
  PropertyRecord *pPVar1;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (propId == -1) {
    pPVar1 = (PropertyRecord *)0x0;
  }
  else {
    pPVar1 = ThreadContext::GetPropertyName(scriptContext->threadContext,propId);
    pPVar1 = pPVar1 + 1;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec2a,(PCWSTR)pPVar1);
}

Assistant:

void ArrayObject::ThrowItemNotConfigurableError(PropertyId propId /*= Constants::NoProperty*/)
    {
        ScriptContext* scriptContext = GetScriptContext();
        JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable,
            propId != Constants::NoProperty ?
                scriptContext->GetThreadContext()->GetPropertyName(propId)->GetBuffer() : nullptr);
    }